

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O2

bool __thiscall DepsLog::RecordId(DepsLog *this,Node *node)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  uint uVar4;
  uint size;
  Node *node_local;
  uint checksum;
  
  iVar1 = (int)(node->env_path_)._M_string_length;
  uVar4 = -iVar1 & 3;
  size = iVar1 + uVar4 + 4;
  node_local = node;
  if (size < 0x80000) {
    sVar3 = fwrite(&size,4,1,(FILE *)this->file_);
    if (sVar3 != 0) {
      sVar3 = fwrite((node->env_path_)._M_dataplus._M_p,(long)iVar1,1,(FILE *)this->file_);
      if (sVar3 == 0) {
        if ((node->env_path_)._M_string_length == 0) {
          __assert_fail("node->path().size() > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/deps_log.cc"
                        ,0x192,"bool DepsLog::RecordId(Node *)");
        }
      }
      else if ((uVar4 == 0) || (sVar3 = fwrite("",(ulong)uVar4,1,(FILE *)this->file_), sVar3 != 0))
      {
        uVar4 = (uint)((ulong)((long)(this->nodes_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->nodes_).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
        checksum = ~uVar4;
        sVar3 = fwrite(&checksum,4,1,(FILE *)this->file_);
        if ((sVar3 != 0) && (iVar1 = fflush((FILE *)this->file_), iVar1 == 0)) {
          node->id_ = uVar4;
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->nodes_,&node_local);
          return true;
        }
      }
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x22;
  }
  return false;
}

Assistant:

bool DepsLog::RecordId(Node* node) {
  int path_size = node->path().size();
  int padding = (4 - path_size % 4) % 4;  // Pad path to 4 byte boundary.

  unsigned size = path_size + padding + 4;
  if (size > kMaxRecordSize) {
    errno = ERANGE;
    return false;
  }
  if (fwrite(&size, 4, 1, file_) < 1)
    return false;
  if (fwrite(node->path().data(), path_size, 1, file_) < 1) {
    assert(node->path().size() > 0);
    return false;
  }
  if (padding && fwrite("\0\0", padding, 1, file_) < 1)
    return false;
  int id = nodes_.size();
  unsigned checksum = ~(unsigned)id;
  if (fwrite(&checksum, 4, 1, file_) < 1)
    return false;
  if (fflush(file_) != 0)
    return false;

  node->set_id(id);
  nodes_.push_back(node);

  return true;
}